

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall
Lowerer::GenerateRecyclerAllocAligned
          (Lowerer *this,JnHelperMethod allocHelper,size_t allocSize,RegOpnd *newObjDst,
          Instr *insertionPointInstr,bool inOpHelper)

{
  LowererMD *this_00;
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  LabelInstr *allocHelperLabel;
  LabelInstr *allocDoneLabel;
  Opnd *opndArg;
  IntConstOpnd *opndArg_00;
  HelperCallOpnd *src1Opnd;
  Instr *instr;
  Lowerer *this_01;
  
  sourceContextId = Func::GetSourceContextId(insertionPointInstr->m_func);
  functionId = Func::GetLocalFunctionId(insertionPointInstr->m_func);
  this_01 = (Lowerer *)&DAT_01441eb0;
  bVar1 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01441eb0,JitAllocNewObjPhase,sourceContextId,functionId);
  allocDoneLabel = (LabelInstr *)0x0;
  if ((allocSize < 0x301) && (!bVar1)) {
    allocHelperLabel = IR::LabelInstr::New(Label,this->m_func,true);
    allocDoneLabel = IR::LabelInstr::New(Label,this->m_func,inOpHelper);
    LowererMD::GenerateFastRecyclerAlloc
              (&this->m_lowererMD,allocSize,newObjDst,insertionPointInstr,allocHelperLabel,
               allocDoneLabel);
    this_01 = (Lowerer *)insertionPointInstr;
    IR::Instr::InsertBefore(insertionPointInstr,&allocHelperLabel->super_Instr);
  }
  this_00 = &this->m_lowererMD;
  opndArg = LoadScriptContextValueOpnd(this_01,insertionPointInstr,ScriptContextRecycler);
  LowererMD::LoadHelperArgument(this_00,insertionPointInstr,opndArg);
  opndArg_00 = IR::IntConstOpnd::New((long)(int)allocSize,TyUint32,this->m_func,true);
  LowererMD::LoadHelperArgument(this_00,insertionPointInstr,&opndArg_00->super_Opnd);
  src1Opnd = IR::HelperCallOpnd::New(allocHelper,this->m_func);
  instr = IR::Instr::New(Call,&newObjDst->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(insertionPointInstr,instr);
  LowererMD::LowerCall(this_00,instr,0);
  if (allocDoneLabel != (LabelInstr *)0x0) {
    IR::Instr::InsertBefore(insertionPointInstr,&allocDoneLabel->super_Instr);
    return;
  }
  return;
}

Assistant:

void
Lowerer::GenerateRecyclerAllocAligned(IR::JnHelperMethod allocHelper, size_t allocSize, IR::RegOpnd* newObjDst, IR::Instr* insertionPointInstr, bool inOpHelper)
{
    IR::LabelInstr * allocDoneLabel = nullptr;

    if (!PHASE_OFF(Js::JitAllocNewObjPhase, insertionPointInstr->m_func) && HeapInfo::IsSmallObject(allocSize))
    {
        IR::LabelInstr * allocHelperLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
        allocDoneLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, inOpHelper);

        this->m_lowererMD.GenerateFastRecyclerAlloc(allocSize, newObjDst, insertionPointInstr, allocHelperLabel, allocDoneLabel);

        // $allocHelper:
        insertionPointInstr->InsertBefore(allocHelperLabel);
    }

    // call JavascriptOperators::AllocMemForScObject(allocSize, scriptContext->GetRecycler())
    this->m_lowererMD.LoadHelperArgument(insertionPointInstr, this->LoadScriptContextValueOpnd(insertionPointInstr, ScriptContextValue::ScriptContextRecycler));
    this->m_lowererMD.LoadHelperArgument(insertionPointInstr, IR::IntConstOpnd::New((int32)allocSize, TyUint32, m_func, true));
    IR::Instr *newObjCall = IR::Instr::New(Js::OpCode::Call, newObjDst,  IR::HelperCallOpnd::New(allocHelper, m_func), m_func);
    insertionPointInstr->InsertBefore(newObjCall);
    this->m_lowererMD.LowerCall(newObjCall, 0);

    if (allocDoneLabel != nullptr)
    {
        // $allocDone:
        insertionPointInstr->InsertBefore(allocDoneLabel);
    }
}